

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O1

bool Memory::
     SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
     ::RescanObjectsOnPage
               (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *block,
               char *pageAddress,char *blockStartAddress,BVStatic<256UL> *heapBlockMarkBits,
               uint localObjectSize,uint bucketIndex,bool *anyObjectRescanned,Recycler *recycler)

{
  MarkData *pMVar1;
  size_t *psVar2;
  ushort uVar3;
  Recycler *pRVar4;
  code *pcVar5;
  bool bVar6;
  BOOLEAN BVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined4 *puVar12;
  char *pcVar13;
  uint pageStartBitIndex;
  char *error;
  uint bitIndex;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  BVIndex BVar20;
  uint uVar21;
  bool bVar22;
  MarkCandidate item;
  
  pMVar1 = &(recycler->collectionStats).markData;
  pMVar1->rescanPageCount = pMVar1->rescanPageCount + 1;
  if (heapBlockMarkBits->data[0].word == 0) {
    uVar14 = 0;
    do {
      uVar18 = uVar14;
      if (uVar18 == 3) break;
      uVar14 = uVar18 + 1;
    } while (heapBlockMarkBits->data[uVar18 + 1].word == 0);
    if (2 < uVar18) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,100,"(!heapBlockMarkBits->IsAllClear())",
                         "!heapBlockMarkBits->IsAllClear()");
      if (!bVar6) goto LAB_0074fd24;
      *puVar12 = 0;
    }
  }
  if (anyObjectRescanned != (bool *)0x0) {
    *anyObjectRescanned = false;
  }
  uVar14 = (long)pageAddress - (long)blockStartAddress;
  if (0xfff < uVar14) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x6b,
                       "((char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize)"
                       ,
                       "(char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize"
                      );
    if (!bVar6) goto LAB_0074fd24;
    *puVar12 = 0;
  }
  uVar18 = (uVar14 & 0xffffffff) / (ulong)localObjectSize;
  uVar17 = (uint)uVar18;
  pcVar13 = blockStartAddress + uVar17 * localObjectSize;
  if (((ulong)pcVar13 & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                       ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                       "HeapInfo::IsAlignedAddress(objectAddress)");
    if (!bVar6) goto LAB_0074fd24;
    *puVar12 = 0;
  }
  if (0xfffefff < (uint)uVar14) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x77,"(pageByteOffset / AutoSystemInfo::PageSize < (32767 * 2 + 1))",
                       "pageByteOffset / AutoSystemInfo::PageSize < USHRT_MAX");
    if (!bVar6) goto LAB_0074fd24;
    *puVar12 = 0;
  }
  if (0x300 < localObjectSize || (localObjectSize & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0xc4,"(IsAlignedSmallObjectSize(sizeCat))",
                       "IsAlignedSmallObjectSize(sizeCat)");
    if (!bVar6) goto LAB_0074fd24;
    *puVar12 = 0;
  }
  uVar21 = (localObjectSize >> 4) - 1;
  if (0x2f < uVar21) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,400,"(index < TBlockAttributes::BucketCount)",
                       "index < TBlockAttributes::BucketCount");
    if (!bVar6) goto LAB_0074fd24;
    *puVar12 = 0;
  }
  pageStartBitIndex = (uint)(uVar14 >> 4) & 0xfffffff;
  uVar14 = uVar14 >> 0xc & 0xffff;
  uVar9 = SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::CalculateMarkCountForPage
                    (heapBlockMarkBits,bucketIndex,pageStartBitIndex);
  uVar3 = *(ushort *)((ulong)uVar21 * 4 + 0x15e5fc2 + uVar14 * 4);
  if (0x1000 / localObjectSize <= uVar17) {
    ReportFatalException(0,-0x7fffbffb,Fatal_Recycler_MemoryCorruption,3);
  }
  bVar6 = SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::CanRescanFullBlock();
  if ((bVar6) && (uVar9 == uVar3)) {
    if ((recycler->collectionState).value == CollectionStateParallelMark) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                         ,0x206,"(this->collectionState != CollectionStateParallelMark)",
                         "this->collectionState != CollectionStateParallelMark");
      if (!bVar6) goto LAB_0074fd24;
      *puVar12 = 0;
    }
    if (pageAddress == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.inl"
                         ,9,"(objectAddress != nullptr)","objectAddress != nullptr");
      if (!bVar6) goto LAB_0074fd24;
      *puVar12 = 0;
    }
    pRVar4 = (recycler->markContext).recycler;
    if ((pRVar4->forceTraceMark != false) ||
       (bVar6 = Js::Phases::IsEnabled(&pRVar4->recyclerFlagsTable->Trace,MarkPhase), bVar6)) {
      Output::Print(L" %p",pageAddress);
    }
    LOCK();
    psVar2 = &(((recycler->markContext).recycler)->collectionStats).scanCount;
    *(int *)psVar2 = (int)*psVar2 + 1;
    UNLOCK();
    item.byteCount = 0x1000;
    item.obj = (void **)pageAddress;
    bVar6 = PageStack<Memory::MarkContext::MarkCandidate>::Push
                      (&(recycler->markContext).markStack,item);
    if (!bVar6) {
      return false;
    }
    psVar2 = &(recycler->collectionStats).markData.rescanObjectCount;
    *psVar2 = *psVar2 + (ulong)(uint)uVar3;
    psVar2 = &(recycler->collectionStats).markData.rescanObjectByteCount;
    *psVar2 = *psVar2 + (ulong)(localObjectSize * uVar3);
    bVar8 = true;
    goto joined_r0x0074fd19;
  }
  uVar15 = (ulong)pcVar13 >> 4 & 0xff;
  if (pcVar13 == pageAddress) {
    bVar6 = true;
  }
  else {
    if (pcVar13 < blockStartAddress || pageAddress <= pcVar13) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x9f,
                         "(startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress)"
                         ,
                         "startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress"
                        );
      if (!bVar6) goto LAB_0074fd24;
      *puVar12 = 0;
    }
    BVar7 = BVStatic<256UL>::Test(heapBlockMarkBits,(BVIndex)uVar15);
    bVar6 = BVar7 != '\x01';
    uVar9 = uVar9 + (BVar7 == '\x01');
  }
  uVar10 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetObjectBitDeltaForBucketIndex
                     (bucketIndex);
  bVar8 = false;
  bVar22 = uVar9 == 0;
  if (!bVar22) {
    uVar19 = 0;
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      uVar17 = (uint)uVar18;
      if (0x1000 / localObjectSize <= uVar17) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                           ,0xae,"(objectIndex < localObjectCount)","objectIndex < localObjectCount"
                          );
        if (!bVar8) goto LAB_0074fd24;
        *puVar12 = 0;
      }
      if (0x2f < bucketIndex) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                           ,0x186,"(index < TBlockAttributes::BucketCount)",
                           "index < TBlockAttributes::BucketCount");
        if (!bVar8) goto LAB_0074fd24;
        *puVar12 = 0;
      }
      BVar20 = (BVIndex)uVar15;
      BVar7 = BVStatic<256UL>::Test
                        (HeapInfo::smallAllocValidPointersMap.invalidBitsBuffers + bucketIndex,
                         BVar20);
      if (BVar7 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                           ,0xaf,
                           "(!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex))"
                           ,
                           "!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex)"
                          );
        if (!bVar8) goto LAB_0074fd24;
        *puVar12 = 0;
      }
      BVar7 = BVStatic<256UL>::Test(heapBlockMarkBits,BVar20);
      if (BVar7 != '\0') {
        bVar8 = SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::RescanObject
                          (&block->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,
                           blockStartAddress + uVar17 * localObjectSize,localObjectSize,uVar17,
                           recycler);
        uVar19 = uVar19 + bVar8;
        if (!bVar8) break;
      }
      uVar17 = uVar17 + 1;
      uVar18 = (ulong)uVar17;
      uVar15 = (ulong)(BVar20 + uVar10);
      bVar22 = uVar19 >= uVar9;
    } while (uVar19 < uVar9);
    bVar8 = uVar19 != 0;
  }
  if (!bVar22) {
    return bVar22;
  }
  uVar11 = SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::CalculateMarkCountForPage
                     (heapBlockMarkBits,bucketIndex,pageStartBitIndex);
  if (pcVar13 == pageAddress || bVar6) {
    if (uVar9 != uVar11) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      error = 
      "(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex))"
      ;
      pcVar13 = 
      "rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex)"
      ;
      uVar9 = 0xc5;
LAB_0074fc51:
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,uVar9,error,pcVar13);
      if (!bVar6) {
LAB_0074fd24:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar12 = 0;
    }
  }
  else if (uVar9 != uVar11 + 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    error = 
    "(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1)"
    ;
    pcVar13 = 
    "rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1"
    ;
    uVar9 = 0xc1;
    goto LAB_0074fc51;
  }
  lVar16 = (ulong)uVar21 * 4 + 0x15e5fc0;
  uVar17 = uVar17 + 1;
  if (uVar17 < *(ushort *)(lVar16 + uVar14 * 4)) {
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    BVar20 = uVar10 * uVar17;
    do {
      BVar7 = BVStatic<256UL>::Test(heapBlockMarkBits,BVar20);
      if (BVar7 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                           ,0xcd,"(!heapBlockMarkBits->Test(i * objectBitDelta))",
                           "!heapBlockMarkBits->Test(i * objectBitDelta)");
        if (!bVar6) goto LAB_0074fd24;
        *puVar12 = 0;
      }
      uVar17 = uVar17 + 1;
      BVar20 = BVar20 + uVar10;
    } while (uVar17 < *(ushort *)(lVar16 + uVar14 * 4));
  }
joined_r0x0074fd19:
  if (anyObjectRescanned != (bool *)0x0) {
    *anyObjectRescanned = bVar8;
  }
  return true;
}

Assistant:

bool
SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(TBlockType * block, char* pageAddress, char * blockStartAddress, BVStatic<TBlockAttributes::BitVectorCount> * heapBlockMarkBits, const uint localObjectSize, uint bucketIndex, __out_opt bool* anyObjectRescanned, Recycler * recycler)
{
    RECYCLER_STATS_ADD(recycler, markData.rescanPageCount, TBlockAttributes::PageCount);

    // By the time we get here, we should have ensured that there's a mark on any page somewhere.
    // REVIEW: Worth check on just the page's mark bits?
    Assert(!heapBlockMarkBits->IsAllClear());

    if (anyObjectRescanned != nullptr)
    {
        *anyObjectRescanned = false;
    }

    Assert((char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize);
    const uint pageByteOffset = static_cast<uint>((char*)pageAddress - blockStartAddress);
    uint firstObjectOnPageIndex = pageByteOffset / localObjectSize;

    // This is not necessarily the address on the first object that starts on the page
    // If the last object on the previous page spans two pages, this is the address of that object
    // We do it this way so that we can figure out if we need to rescan the first few bytes of the page
    // if the actual first object on this page is not located at the start of the page
    char* const startObjectAddress = blockStartAddress + (firstObjectOnPageIndex * localObjectSize);
    const uint startBitIndex = TBlockType::GetAddressBitIndex(startObjectAddress);
    const uint pageStartBitIndex = pageByteOffset >> HeapConstants::ObjectAllocationShift;

    Assert(pageByteOffset / AutoSystemInfo::PageSize < USHRT_MAX);
    const ushort pageNumber = static_cast<const ushort>(pageByteOffset / AutoSystemInfo::PageSize);
    const typename TBlockType::BlockInfo& blockInfoForPage = HeapInfo::GetBlockInfo<TBlockAttributes>(localObjectSize)[pageNumber];

    bool lastObjectOnPreviousPageMarked = false;
    // Calculate the mark count here since we no longer keep track during marking
    uint rescanMarkCount = TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex);
    const uint pageObjectCount = blockInfoForPage.pageObjectCount;
    const uint localObjectCount = (TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / localObjectSize;

    // With protected unallocatable ending pages and reset writewatch, we should never be scanning on these pages.
    if (firstObjectOnPageIndex >= localObjectCount)
    {
        ReportFatalException(NULL, E_FAIL, Fatal_Recycler_MemoryCorruption, 3);
    }

    // If all objects are marked, rescan whole block at once
    if (TBlockType::CanRescanFullBlock() && rescanMarkCount == pageObjectCount)
    {
        // REVIEW: Can we optimize this more?
        if (!recycler->AddMark(pageAddress, AutoSystemInfo::PageSize))
        {
            // Failed to add to the mark stack due to OOM.
            return false;
        }

        RECYCLER_STATS_ADD(recycler, markData.rescanObjectCount, pageObjectCount);
        RECYCLER_STATS_ADD(recycler, markData.rescanObjectByteCount, localObjectSize * pageObjectCount);
        if (anyObjectRescanned != nullptr)
        {
            *anyObjectRescanned = true;
        }

        return true;
    }

    if (startObjectAddress != pageAddress)
    {
        // If the last object on the previous page that spans into the current page is marked,
        // we need to count that in the markCount for rescan
        Assert(startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress);
        lastObjectOnPreviousPageMarked = (heapBlockMarkBits->Test(startBitIndex) == TRUE);
        if (lastObjectOnPreviousPageMarked)
        {
            rescanMarkCount++;
        }
    }

    const uint objectBitDelta = SmallHeapBlockT<TBlockAttributes>::GetObjectBitDeltaForBucketIndex(bucketIndex);

    uint rescanCount = 0;
    uint objectIndex = firstObjectOnPageIndex;

    for (uint bitIndex = startBitIndex; rescanCount < rescanMarkCount; objectIndex++, bitIndex += objectBitDelta)
    {
        Assert(objectIndex < localObjectCount);
        Assert(!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex));

        if (heapBlockMarkBits->Test(bitIndex))
        {
            char * objectAddress = blockStartAddress + objectIndex * localObjectSize;
            if (!TBlockType::RescanObject(block, objectAddress, localObjectSize, objectIndex, recycler))
            {
                // Failed to add to the mark stack due to OOM.
                return false;
            }

            rescanCount++;
        }
    }

    // Mark bits should not have changed during the Rescan
    if (startObjectAddress != pageAddress && lastObjectOnPreviousPageMarked)
    {
        Assert(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1);
    }
    else
    {
        Assert(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex));
    }

#if DBG
    // We stopped when we hit the rescanMarkCount.
    // Make sure no other objects were marked, otherwise our rescanMarkCount was wrong.
    for (uint i = objectIndex + 1; i < blockInfoForPage.lastObjectIndexOnPage; i++)
    {
        Assert(!heapBlockMarkBits->Test(i * objectBitDelta));
    }
#endif

    // Let the caller know if we rescanned anything on this page
    if (anyObjectRescanned != nullptr)
    {
        (*anyObjectRescanned) = (rescanCount > 0);
    }

    return true;
}